

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O3

int ShrinkLoop(uchar *out,uint outsize,FileReader *In,uint InLeft)

{
  long lVar1;
  long lVar2;
  byte *pbVar3;
  short sVar4;
  ushort uVar5;
  char *pcVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  sbyte sVar16;
  uint uVar17;
  ushort uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  bool bVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  int iVar35;
  int iVar37;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  uchar ReadBuf [256];
  unsigned_short Parent [8192];
  uchar Stack [8192];
  uchar Value [8192];
  int local_8164;
  uint local_8160;
  byte local_8138 [256];
  undefined2 uStack_8038;
  short local_8036 [3];
  undefined8 auStack_8030 [63];
  ushort local_7e36 [12030];
  char local_203a;
  char local_2039;
  char acStack_2038 [8200];
  
  cVar27 = '\0';
  cVar28 = '\x01';
  cVar29 = '\x02';
  cVar30 = '\x03';
  cVar31 = '\x04';
  cVar32 = '\x05';
  cVar33 = '\x06';
  cVar34 = '\a';
  lVar9 = 0;
  do {
    acStack_2038[lVar9] = cVar27;
    acStack_2038[lVar9 + 1] = cVar28;
    acStack_2038[lVar9 + 2] = cVar29;
    acStack_2038[lVar9 + 3] = cVar30;
    acStack_2038[lVar9 + 4] = cVar31;
    acStack_2038[lVar9 + 5] = cVar32;
    acStack_2038[lVar9 + 6] = cVar33;
    acStack_2038[lVar9 + 7] = cVar34;
    *(undefined8 *)((long)auStack_8030 + lVar9 * 2 + -8) = 0x100010001000100;
    *(undefined8 *)((long)auStack_8030 + lVar9 * 2) = 0x100010001000100;
    lVar9 = lVar9 + 8;
    cVar27 = cVar27 + '\b';
    cVar28 = cVar28 + '\b';
    cVar29 = cVar29 + '\b';
    cVar30 = cVar30 + '\b';
    cVar31 = cVar31 + '\b';
    cVar32 = cVar32 + '\b';
    cVar33 = cVar33 + '\b';
    cVar34 = cVar34 + '\b';
  } while (lVar9 != 0x100);
  lVar9 = 0;
  do {
    auVar36._8_4_ = (int)lVar9;
    auVar36._0_8_ = lVar9;
    auVar36._12_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar38 = (auVar36 | _DAT_0073b2f0) ^ _DAT_0073b300;
    iVar35 = auVar38._0_4_;
    iVar37 = auVar38._8_4_;
    auVar43._4_4_ = iVar35;
    auVar43._0_4_ = iVar35;
    auVar43._8_4_ = iVar37;
    auVar43._12_4_ = iVar37;
    auVar47._0_4_ = -(uint)(iVar35 < -0x7fffe101);
    auVar47._4_4_ = -(uint)(iVar35 < -0x7fffe101);
    auVar47._8_4_ = -(uint)(iVar37 < -0x7fffe101);
    auVar47._12_4_ = -(uint)(iVar37 < -0x7fffe101);
    auVar39._0_4_ = -(uint)(auVar38._4_4_ == -0x80000000);
    auVar39._4_4_ = -(uint)(auVar38._4_4_ == -0x80000000);
    auVar39._8_4_ = -(uint)(auVar38._12_4_ == -0x80000000);
    auVar39._12_4_ = -(uint)(auVar38._12_4_ == -0x80000000);
    auVar39 = auVar39 & auVar47;
    auVar38 = pshuflw(auVar43,auVar39,0xe8);
    auVar38 = packssdw(auVar38,auVar38);
    if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_7e36[lVar9] = 0x2000;
    }
    auVar38 = packssdw(auVar39,auVar39);
    auVar38 = packssdw(auVar38,auVar38);
    if ((auVar38._0_4_ >> 0x10 & 1) != 0) {
      local_7e36[lVar9 + 1] = 0x2000;
    }
    auVar38 = (auVar36 | _DAT_0073c1a0) ^ _DAT_0073b300;
    iVar35 = auVar38._0_4_;
    iVar37 = auVar38._8_4_;
    auVar44._4_4_ = iVar35;
    auVar44._0_4_ = iVar35;
    auVar44._8_4_ = iVar37;
    auVar44._12_4_ = iVar37;
    auVar48._0_4_ = -(uint)(iVar35 < -0x7fffe101);
    auVar48._4_4_ = -(uint)(iVar35 < -0x7fffe101);
    auVar48._8_4_ = -(uint)(iVar37 < -0x7fffe101);
    auVar48._12_4_ = -(uint)(iVar37 < -0x7fffe101);
    auVar40._0_4_ = -(uint)(auVar38._4_4_ == -0x80000000);
    auVar40._4_4_ = -(uint)(auVar38._4_4_ == -0x80000000);
    auVar40._8_4_ = -(uint)(auVar38._12_4_ == -0x80000000);
    auVar40._12_4_ = -(uint)(auVar38._12_4_ == -0x80000000);
    auVar40 = auVar40 & auVar48;
    auVar38 = packssdw(auVar44,auVar40);
    auVar38 = packssdw(auVar38,auVar38);
    if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_7e36[lVar9 + 2] = 0x2000;
    }
    auVar38 = pshufhw(auVar40,auVar40,0x84);
    auVar38 = packssdw(auVar38,auVar38);
    if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_7e36[lVar9 + 3] = 0x2000;
    }
    auVar38 = (auVar36 | _DAT_0073c190) ^ _DAT_0073b300;
    iVar35 = auVar38._0_4_;
    iVar37 = auVar38._8_4_;
    auVar45._4_4_ = iVar35;
    auVar45._0_4_ = iVar35;
    auVar45._8_4_ = iVar37;
    auVar45._12_4_ = iVar37;
    auVar49._0_4_ = -(uint)(iVar35 < -0x7fffe101);
    auVar49._4_4_ = -(uint)(iVar35 < -0x7fffe101);
    auVar49._8_4_ = -(uint)(iVar37 < -0x7fffe101);
    auVar49._12_4_ = -(uint)(iVar37 < -0x7fffe101);
    auVar41._0_4_ = -(uint)(auVar38._4_4_ == -0x80000000);
    auVar41._4_4_ = -(uint)(auVar38._4_4_ == -0x80000000);
    auVar41._8_4_ = -(uint)(auVar38._12_4_ == -0x80000000);
    auVar41._12_4_ = -(uint)(auVar38._12_4_ == -0x80000000);
    auVar41 = auVar41 & auVar49;
    auVar38 = pshuflw(auVar45,auVar41,0xe8);
    auVar38 = packssdw(auVar38,auVar38);
    if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_7e36[lVar9 + 4] = 0x2000;
    }
    auVar38 = packssdw(auVar41,auVar41);
    auVar38 = packssdw(auVar38,auVar38);
    if ((auVar38 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      local_7e36[lVar9 + 5] = 0x2000;
    }
    auVar36 = (auVar36 | _DAT_0073c180) ^ _DAT_0073b300;
    iVar35 = auVar36._0_4_;
    iVar37 = auVar36._8_4_;
    auVar42._4_4_ = iVar35;
    auVar42._0_4_ = iVar35;
    auVar42._8_4_ = iVar37;
    auVar42._12_4_ = iVar37;
    auVar46._0_4_ = -(uint)(iVar35 < -0x7fffe101);
    auVar46._4_4_ = -(uint)(iVar35 < -0x7fffe101);
    auVar46._8_4_ = -(uint)(iVar37 < -0x7fffe101);
    auVar46._12_4_ = -(uint)(iVar37 < -0x7fffe101);
    auVar38._0_4_ = -(uint)(auVar36._4_4_ == -0x80000000);
    auVar38._4_4_ = -(uint)(auVar36._4_4_ == -0x80000000);
    auVar38._8_4_ = -(uint)(auVar36._12_4_ == -0x80000000);
    auVar38._12_4_ = -(uint)(auVar36._12_4_ == -0x80000000);
    auVar38 = auVar38 & auVar46;
    auVar36 = packssdw(auVar42,auVar38);
    auVar36 = packssdw(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_7e36[lVar9 + 6] = 0x2000;
    }
    auVar36 = pshufhw(auVar38,auVar38,0x84);
    auVar36 = packssdw(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_7e36[lVar9 + 7] = 0x2000;
    }
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x1f00);
  uVar8 = 0;
  uVar14 = 0;
  uVar24 = 0;
  sVar16 = 0;
  bVar7 = true;
  do {
    bVar22 = bVar7;
    if (InLeft == 0) {
      InLeft = 0;
      bVar10 = 0;
    }
    else {
      InLeft = InLeft - 1;
      if (uVar14 < uVar8) {
        uVar13 = (ulong)uVar14;
        uVar14 = uVar14 + 1;
        bVar10 = local_8138[uVar13];
      }
      else {
        uVar8 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])(In,local_8138,0x100);
        uVar14 = 1;
        bVar10 = local_8138[0];
      }
    }
    uVar24 = uVar24 + ((uint)bVar10 << sVar16);
    sVar16 = 8;
    bVar7 = false;
  } while (bVar22);
  if (outsize != 0) {
    *out = (uchar)uVar24;
  }
  uVar15 = (uint)(outsize != 0);
  if (uVar15 < outsize) {
    local_8160 = uVar24 & 0x1ff;
    uVar24 = uVar24 >> 9;
    local_8164 = 0x100;
    uVar23 = 7;
    uVar21 = 9;
    do {
      bVar10 = (byte)uVar21;
      uVar17 = ~(-1 << (bVar10 & 0x1f));
      while( true ) {
        for (; uVar23 < uVar21; uVar23 = uVar23 + 8) {
          if (InLeft == 0) {
            InLeft = 0;
            bVar11 = 0;
          }
          else {
            InLeft = InLeft - 1;
            if (uVar14 < uVar8) {
              uVar13 = (ulong)uVar14;
              uVar14 = uVar14 + 1;
              bVar11 = local_8138[uVar13];
            }
            else {
              uVar8 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])(In,local_8138,0x100);
              uVar14 = 1;
              bVar11 = local_8138[0];
            }
          }
          bVar12 = (byte)uVar23;
          uVar24 = uVar24 + ((uint)bVar11 << (bVar12 & 0x1f));
        }
        uVar25 = uVar24 >> (bVar10 & 0x1f);
        uVar26 = uVar24 & uVar17;
        uVar23 = uVar23 - uVar21;
        if (uVar26 == 0x100) break;
        sVar4 = *(short *)((long)auStack_8030 + (ulong)uVar26 * 2 + -8);
        uVar24 = uVar26;
        pcVar6 = &local_2039;
        if (sVar4 == 0x2000) {
          uVar24 = local_8160;
          pcVar6 = &local_203a;
        }
        lVar9 = -1;
        lVar1 = 0;
        do {
          lVar20 = lVar1;
          lVar19 = lVar9;
          cVar27 = acStack_2038[(int)uVar24];
          pcVar6[lVar20] = cVar27;
          uVar24 = *(ushort *)((long)auStack_8030 + (long)(int)uVar24 * 2 + -8) & 0x1fff;
          lVar9 = lVar19 + -1;
          lVar1 = lVar20 + -1;
        } while (uVar24 != 0x100);
        if (sVar4 == 0x2000) {
          local_2039 = cVar27;
        }
        lVar1 = (long)local_8164 * 2;
        lVar9 = 0;
        do {
          lVar2 = lVar9 * 2;
          lVar9 = lVar9 + 1;
        } while (*(short *)((long)auStack_8030 + lVar2 + lVar1 + -6) != 0x2000);
        *(short *)((long)auStack_8030 + lVar9 * 2 + lVar1 + -8) = (short)local_8160;
        acStack_2038[lVar9 + local_8164] = pcVar6[lVar20];
        do {
          uVar13 = (ulong)uVar15;
          uVar15 = uVar15 + 1;
          out[uVar13] = pcVar6[lVar19 + 1];
          lVar19 = lVar19 + 1;
        } while ((uint)(sVar4 == 0x2000) != (uint)lVar19);
        local_8164 = local_8164 + (int)lVar9;
        uVar24 = uVar25;
        local_8160 = uVar26;
        if (outsize <= uVar15) {
          return 0;
        }
      }
      for (; uVar23 < uVar21; uVar23 = uVar23 + 8) {
        if (InLeft == 0) {
          InLeft = 0;
          bVar11 = 0;
        }
        else {
          InLeft = InLeft - 1;
          if (uVar14 < uVar8) {
            uVar13 = (ulong)uVar14;
            uVar14 = uVar14 + 1;
            bVar11 = local_8138[uVar13];
          }
          else {
            uVar8 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])(In,local_8138,0x100);
            uVar14 = 1;
            bVar11 = local_8138[0];
          }
        }
        uVar25 = uVar25 + ((uint)bVar11 << ((byte)uVar23 & 0x1f));
      }
      uVar17 = uVar17 & uVar25;
      uVar24 = uVar25 >> (bVar10 & 0x1f);
      if (uVar17 == 1) {
        uVar25 = uVar21 + 1;
      }
      else {
        uVar25 = uVar21;
        if (uVar17 == 2) {
          lVar9 = 0x101;
          do {
            uVar17 = *(ushort *)((long)auStack_8030 + lVar9 * 2 + -8) & 0x1fff;
            if (0x100 < uVar17) {
              pbVar3 = (byte *)((long)auStack_8030 + (ulong)uVar17 * 2 + -7);
              *pbVar3 = *pbVar3 | 0x40;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x2000);
          lVar9 = 0x101;
          do {
            uVar5 = *(ushort *)((long)auStack_8030 + lVar9 * 2 + -8);
            uVar18 = uVar5 & 0xbfff;
            if ((uVar5 >> 0xe & 1) == 0) {
              uVar18 = 0x2000;
            }
            *(ushort *)((long)auStack_8030 + lVar9 * 2 + -8) = uVar18;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x2000);
          local_8164 = 0x100;
        }
      }
      uVar23 = uVar23 - uVar21;
      uVar21 = uVar25;
    } while (uVar15 < outsize);
  }
  return 0;
}

Assistant:

int ShrinkLoop(unsigned char *out, unsigned int outsize,
			   FileReader *In, unsigned int InLeft)
{
	unsigned char ReadBuf[256];
	unsigned short Parent[HSIZE];
	unsigned char Value[HSIZE], Stack[HSIZE];
	unsigned char *newstr;
	int len;
	int KwKwK, codesize = 9;	/* start at 9 bits/code */
	int code, oldcode, freecode, curcode;
	unsigned int Bits = 0, Hold = 0;
	unsigned int size = 0;
	unsigned int bs = 0, be = 0;

	freecode = BOGUSCODE;
	for (code = 0; code < BOGUSCODE; code++)
	{
		Value[code] = code;
		Parent[code] = BOGUSCODE;
	}
	for (code = BOGUSCODE+1; code < HSIZE; code++)
		Parent[code] = FREE_CODE;

	READBITS(oldcode, codesize);
	if (size < outsize) {
		out[size++] = oldcode;
	}

	while (size < outsize)
	{
		READBITS(code, codesize);
		if (code == BOGUSCODE) {	/* possible to have consecutive escapes? */
			READBITS(code, codesize);
			if (code == 1) {
				codesize++;
			} else if (code == 2) {
				/* clear leafs (nodes with no children) */
				/* first loop:  mark each parent as such */
				for (code = BOGUSCODE+1;  code < HSIZE;  ++code) {
					curcode = (Parent[code] & CODE_MASK);

					if (curcode > BOGUSCODE)
						Parent[curcode] |= HAS_CHILD;		/* set parent's child-bit */
				}

				/* second loop:  clear all nodes *not* marked as parents; reset flag bits */
				for (code = BOGUSCODE+1;  code < HSIZE;  ++code) {
					if (Parent[code] & HAS_CHILD) {		/* just clear child-bit */
						Parent[code] &= ~HAS_CHILD;
					} else {							/* leaf:  lose it */
						Parent[code] = FREE_CODE;
					}
				}
				freecode = BOGUSCODE;
			}
			continue;
		}

		newstr = &Stack[HSIZE-1];
		curcode = code;

		if (Parent[curcode] == FREE_CODE) {
			KwKwK = 1;
			newstr--;	/* last character will be same as first character */
			curcode = oldcode;
			len = 1;
		} else {
			KwKwK = 0;
			len = 0;
		}

		do {
			*newstr-- = Value[curcode];
			len++;
			curcode = (Parent[curcode] & CODE_MASK);
		} while (curcode != BOGUSCODE);

		newstr++;
		if (KwKwK) {
			Stack[HSIZE-1] = *newstr;
		}

		do {
			freecode++;
		} while (Parent[freecode] != FREE_CODE);

		Parent[freecode] = oldcode;
		Value[freecode] = *newstr;
		oldcode = code;

		while (len--) {
			out[size++] = *newstr++;
		}
	}
	return 0;
}